

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O2

ForwardTypeRestriction slang::ast::SemanticFacts::getTypeRestriction(Type *type)

{
  ForwardTypeRestriction FVar1;
  Type *pTVar2;
  
  pTVar2 = Type::getCanonicalType(type);
  switch((pTVar2->super_Symbol).kind) {
  case EnumType:
    FVar1 = Enum;
    break;
  default:
    FVar1 = None;
    break;
  case PackedStructType:
  case UnpackedStructType:
    FVar1 = Struct;
    break;
  case PackedUnionType:
  case UnpackedUnionType:
    FVar1 = Union;
    break;
  case ClassType:
    FVar1 = *(byte *)((long)&pTVar2[2].super_Symbol.kind + 1) | Class;
  }
  return FVar1;
}

Assistant:

ForwardTypeRestriction SemanticFacts::getTypeRestriction(const Type& type) {
    auto& ct = type.getCanonicalType();
    switch (ct.kind) {
        case SymbolKind::PackedStructType:
        case SymbolKind::UnpackedStructType:
            return ForwardTypeRestriction::Struct;
        case SymbolKind::PackedUnionType:
        case SymbolKind::UnpackedUnionType:
            return ForwardTypeRestriction::Union;
        case SymbolKind::EnumType:
            return ForwardTypeRestriction::Enum;
        case SymbolKind::ClassType:
            if (ct.as<ClassType>().isInterface)
                return ForwardTypeRestriction::InterfaceClass;
            return ForwardTypeRestriction::Class;
        default:
            return ForwardTypeRestriction::None;
    }
}